

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

Message * __thiscall helics::MessageHolder::newMessage(MessageHolder *this)

{
  pointer piVar1;
  pointer puVar2;
  Message *pMVar3;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> __s;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> tVar4;
  pointer *__ptr;
  pointer puVar5;
  int iVar6;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_28;
  
  piVar1 = (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar1) {
    tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)
         operator_new(0x100);
    memset((void *)tVar4.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl,0,0xf8);
    *(size_t *)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x58) = 0x40;
    *(SmallBuffer **)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60) =
         (SmallBuffer *)
         ((long)tVar4.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x10);
    (((string *)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70))->_M_dataplus)._M_p
         = (pointer)((long)tVar4.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x80);
    (((string *)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90))->_M_dataplus)._M_p
         = (pointer)((long)tVar4.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xa0);
    (((string *)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xb0))->_M_dataplus)._M_p
         = (pointer)((long)tVar4.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xc0);
    (((string *)
     ((long)tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd0))->_M_dataplus)._M_p
         = (pointer)((long)tVar4.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xe0);
    *(void **)((long)tVar4.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf8) =
         (void *)0x0;
    local_28._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
    ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
              ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                *)this,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_28);
    if ((_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)
        local_28._M_t.
        super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_28,
                 (Message *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
    }
    puVar2 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar5 = puVar2 + -1;
    iVar6 = (int)((ulong)((long)puVar2 -
                         (long)(this->messages).
                               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  else {
    iVar6 = piVar1[-1];
    (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
    __s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)
         operator_new(0x100);
    memset((void *)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl,0,0xf8);
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x58) = 0x40;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x10;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x80;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xa0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xb0) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xc0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd0) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xe0;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf8) = 0;
    puVar5 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_> *)
          &puVar5[iVar6]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>;
    puVar5[iVar6]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
         = __s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    if (tVar4.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
        (_Head_base<0UL,_helics::Message_*,_false>)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)(puVar5 + iVar6),
                 (Message *)
                 tVar4.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
    }
    puVar5 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar6;
  }
  pMVar3 = (puVar5->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  pMVar3->counter = iVar6;
  pMVar3->messageValidation = 0xb3;
  pMVar3->backReference = this;
  return pMVar3;
}

Assistant:

Message* MessageHolder::newMessage()
{
    Message* message{nullptr};
    if (!freeMessageSlots.empty()) {
        auto index = freeMessageSlots.back();
        freeMessageSlots.pop_back();
        messages[index] = std::make_unique<Message>();
        message = messages[index].get();
        message->counter = index;

    } else {
        messages.push_back(std::make_unique<Message>());
        message = messages.back().get();
        message->counter = static_cast<int32_t>(messages.size()) - 1;
    }

    message->messageValidation = messageKeyCode;
    message->backReference = static_cast<void*>(this);
    return message;
}